

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLcycleFams.c
# Opt level: O0

void RDL_deleteCycleFams(RDL_cfURF *rc)

{
  uint local_14;
  uint i;
  RDL_cfURF *rc_local;
  
  for (local_14 = 0; local_14 < rc->nofFams; local_14 = local_14 + 1) {
    free(rc->fams[local_14]->prototype);
    free(rc->fams[local_14]);
  }
  free(rc->fams);
  free(rc);
  return;
}

Assistant:

void RDL_deleteCycleFams(RDL_cfURF *rc)
{
  unsigned i;
  for(i=0; i<rc->nofFams; ++i)
  {
    free(rc->fams[i]->prototype);
    free(rc->fams[i]);
  }
  free(rc->fams);
  free(rc);
}